

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

int __thiscall
cmExtraCodeBlocksGenerator::GetCBTargetType
          (cmExtraCodeBlocksGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  uint uVar3;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  switch(TVar2) {
  case EXECUTABLE:
    std::__cxx11::string::string((string *)&local_38,"WIN32_EXECUTABLE",&local_59);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_38);
    uVar3 = 0;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_58,"MACOSX_BUNDLE",&local_5a);
      bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      uVar3 = (uint)!bVar1;
    }
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case STATIC_LIBRARY:
  case OBJECT_LIBRARY:
    uVar3 = 2;
    break;
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    uVar3 = 3;
    break;
  default:
    uVar3 = 4;
  }
  return uVar3;
}

Assistant:

int cmExtraCodeBlocksGenerator::GetCBTargetType(cmGeneratorTarget* target)
{
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      if ((target->GetPropertyAsBool("WIN32_EXECUTABLE")) ||
          (target->GetPropertyAsBool("MACOSX_BUNDLE"))) {
        return 0;
      }
      return 1;
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return 2;
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      return 3;
    default:
      return 4;
  }
}